

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall absl::strings_internal::BigUnsigned<4>::ShiftLeft(BigUnsigned<4> *this,int count)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (0 < count) {
    uVar1 = this->size_;
    if ((uint)count < 0x80) {
      uVar3 = (uint)count >> 5;
      iVar4 = uVar1 + uVar3;
      iVar6 = 4;
      if (iVar4 < 4) {
        iVar6 = iVar4;
      }
      this->size_ = iVar6;
      if ((count & 0x1fU) == 0) {
        lVar8 = (long)iVar6 * 4 + 4;
        lVar5 = lVar8 - (ulong)(uVar3 * 4);
        if (lVar5 != 4) {
          __n = lVar5 - 4;
          memmove((void *)((long)this + (lVar8 - __n)),this->words_,__n);
        }
      }
      else {
        iVar7 = 3;
        if (iVar4 < 3) {
          iVar7 = iVar4;
        }
        if ((int)uVar3 < iVar7) {
          iVar7 = 3;
          if (iVar4 < 3) {
            iVar7 = iVar4;
          }
          lVar8 = (long)iVar7;
          do {
            bVar2 = (byte)count & 0x1f;
            this->words_[lVar8] =
                 *(int *)((long)this + lVar8 * 4 + -(ulong)(uVar3 * 4) + 4) << bVar2 |
                 *(uint *)((long)this + lVar8 * 4 + -(ulong)(uVar3 * 4)) >> 0x20 - bVar2;
            lVar8 = lVar8 + -1;
          } while ((long)(ulong)uVar3 < lVar8);
        }
        this->words_[uVar3] = this->words_[0] << (sbyte)(count & 0x1fU);
        if ((iVar4 < 4) && (this->words_[iVar6] != 0)) {
          this->size_ = iVar6 + 1;
        }
      }
      if (0x1f < (uint)count) {
        memset(this->words_,0,(ulong)(uVar3 << 2));
        return;
      }
    }
    else {
      if (0 < (int)uVar1) {
        memset(this->words_,0,(ulong)uVar1 << 2);
      }
      this->size_ = 0;
    }
  }
  return;
}

Assistant:

void ShiftLeft(int count) {
    if (count > 0) {
      const int word_shift = count / 32;
      if (word_shift >= max_words) {
        SetToZero();
        return;
      }
      size_ = (std::min)(size_ + word_shift, max_words);
      count %= 32;
      if (count == 0) {
// https://gcc.gnu.org/bugzilla/show_bug.cgi?id=warray-bounds
// shows a lot of bogus -Warray-bounds warnings under GCC.
// This is not the only one in Abseil.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
        std::copy_backward(words_, words_ + size_ - word_shift, words_ + size_);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic pop
#endif
      } else {
        for (int i = (std::min)(size_, max_words - 1); i > word_shift; --i) {
          words_[i] = (words_[i - word_shift] << count) |
                      (words_[i - word_shift - 1] >> (32 - count));
        }
        words_[word_shift] = words_[0] << count;
        // Grow size_ if necessary.
        if (size_ < max_words && words_[size_]) {
          ++size_;
        }
      }
      std::fill_n(words_, word_shift, 0u);
    }
  }